

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  uchar *buf_00;
  size_t sVar3;
  int rc;
  uchar *buf;
  FILE *io;
  int i;
  char *profile;
  int retval;
  char **argv_local;
  int argc_local;
  
  profile._4_4_ = 0;
  printf("MojoShader testparse\n");
  printf("Compiled against changeset %s\n","???");
  pcVar2 = MOJOSHADER_changeset();
  printf("Linked against changeset %s\n",pcVar2);
  printf("\n");
  if (argc < 3) {
    printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n",*argv);
  }
  else {
    pcVar2 = argv[1];
    for (io._4_4_ = 2; io._4_4_ < argc; io._4_4_ = io._4_4_ + 1) {
      __stream = fopen(argv[io._4_4_],"rb");
      if (__stream == (FILE *)0x0) {
        printf(" ... fopen(\'%s\') failed.\n",argv[io._4_4_]);
      }
      else {
        buf_00 = (uchar *)malloc(1000000);
        sVar3 = fread(buf_00,1,1000000,__stream);
        fclose(__stream);
        iVar1 = do_parse(argv[io._4_4_],buf_00,(int)sVar3,pcVar2);
        if (iVar1 == 0) {
          profile._4_4_ = 1;
        }
        free(buf_00);
      }
    }
  }
  return profile._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    int retval = 0;

    printf("MojoShader testparse\n");
    printf("Compiled against changeset %s\n", MOJOSHADER_CHANGESET);
    printf("Linked against changeset %s\n", MOJOSHADER_changeset());
    printf("\n");

    if (argc <= 2)
        printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n", argv[0]);
    else
    {
        const char *profile = argv[1];
        int i;

        for (i = 2; i < argc; i++)
        {
            FILE *io = fopen(argv[i], "rb");
            if (io == NULL)
                printf(" ... fopen('%s') failed.\n", argv[i]);
            else
            {
                unsigned char *buf = (unsigned char *) malloc(1000000);
                int rc = fread(buf, 1, 1000000, io);
                fclose(io);
                if (!do_parse(argv[i], buf, rc, profile))
                    retval = 1;
                free(buf);
            } // else
        } // for
    } // else

    return retval;
}